

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpServer.cpp
# Opt level: O2

void FIX::HttpServer::stopGlobal(void)

{
  Mutex::lock((Mutex *)s_mutex);
  s_count = s_count + -1;
  if (s_pServer != (HttpServer *)0x0 && s_count == 0) {
    stop(s_pServer);
    if (s_pServer != (HttpServer *)0x0) {
      (*(s_pServer->super_Strategy)._vptr_Strategy[1])();
    }
    s_pServer = (HttpServer *)0x0;
  }
  Mutex::unlock((Mutex *)s_mutex);
  return;
}

Assistant:

void HttpServer::stop()
{
  if( m_stop ) return;
  m_stop = true;
  onStop();

  if( m_threadid )
    thread_join( m_threadid );
  m_threadid = 0;
}